

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O2

void close_socket(DESCRIPTOR_DATA *dclose)

{
  time_t tVar1;
  int iVar2;
  DESCRIPTOR_DATA **ppDVar3;
  DESCRIPTOR_DATA *pDVar4;
  time_t tVar5;
  char *pcVar6;
  uint uVar7;
  CHAR_DATA *pCVar8;
  string_view fmt;
  string_view fmt_00;
  char buf [4608];
  
  if (0 < dclose->outtop) {
    process_output(dclose,false);
  }
  if (dclose->snoop_by != (DESCRIPTOR_DATA *)0x0) {
    write_to_buffer(dclose->snoop_by,"Your victim has left the game.\n\r",0);
  }
  ppDVar3 = &descriptor_list;
  while (ppDVar3 = &((DESCRIPTOR_DATA *)ppDVar3)->next->next,
        (DESCRIPTOR_DATA *)ppDVar3 != (DESCRIPTOR_DATA *)0x0) {
    if (((DESCRIPTOR_DATA *)ppDVar3)->snoop_by == dclose) {
      ((DESCRIPTOR_DATA *)ppDVar3)->snoop_by = (DESCRIPTOR_DATA *)0x0;
    }
  }
  pCVar8 = dclose->character;
  if (pCVar8 != (CHAR_DATA *)0x0) {
    fmt._M_str = "Closing link to {}.";
    fmt._M_len = 0x13;
    CLogger::Info<char*&>((CLogger *)&RS.field_0x140,fmt,&pCVar8->name);
    iVar2 = (int)current_time;
    if ((dclose->connected == 0) && (merc_down == false)) {
      tVar1 = pCVar8->last_fight_time;
      tVar5 = tVar1;
      if (pCVar8->invis_level < 0x33) {
        act("$n has lost $s link.",pCVar8,(void *)0x0,(void *)0x0,0);
        tVar5 = pCVar8->last_fight_time;
      }
      uVar7 = iVar2 - (int)tVar1;
      pcVar6 = "nobody";
      if (pCVar8->last_fight_name != (char *)0x0) {
        pcVar6 = pCVar8->last_fight_name;
      }
      if (tVar5 == 0) {
        uVar7 = 0xffffffff;
      }
      else if (600 < (int)uVar7) {
        uVar7 = uVar7 / 0x3c;
      }
      sprintf(buf,"$N has lost $S link (Last fought %s %d %s ago).",pcVar6,(ulong)uVar7);
      iVar2 = get_trust(pCVar8);
      wiznet(buf,pCVar8,(OBJ_DATA *)0x0,4,0,iVar2);
      pCVar8->desc = (DESCRIPTOR_DATA *)0x0;
    }
    else {
      pCVar8 = dclose->original;
      if (pCVar8 == (CHAR_DATA *)0x0) {
        pCVar8 = dclose->character;
      }
      free_char(pCVar8);
    }
  }
  if (d_next == dclose) {
    d_next = d_next->next;
  }
  ppDVar3 = &descriptor_list;
  pDVar4 = descriptor_list;
  if (descriptor_list == dclose) {
    pDVar4 = descriptor_list->next;
  }
  else {
    do {
      ppDVar3 = &pDVar4->next;
      if ((DESCRIPTOR_DATA *)ppDVar3 == (DESCRIPTOR_DATA *)0x0) {
        fmt_00._M_str = "Close_socket: dclose not found.";
        fmt_00._M_len = 0x1f;
        CLogger::Warn<>((CLogger *)&RS.field_0x140,fmt_00);
        goto LAB_002d2a0d;
      }
      pDVar4 = ((DESCRIPTOR_DATA *)ppDVar3)->next;
    } while (((DESCRIPTOR_DATA *)ppDVar3)->next != dclose);
    pDVar4 = dclose->next;
  }
  ((DESCRIPTOR_DATA *)ppDVar3)->next = pDVar4;
LAB_002d2a0d:
  close((int)dclose->descriptor);
  free_descriptor(dclose);
  return;
}

Assistant:

void close_socket(DESCRIPTOR_DATA *dclose)
{
	CHAR_DATA *ch;
	char buf[MAX_STRING_LENGTH];

	if (dclose->outtop > 0)
		process_output(dclose, false);

	if (dclose->snoop_by != nullptr)
	{
		write_to_buffer(dclose->snoop_by, "Your victim has left the game.\n\r", 0);
	}

	{
		DESCRIPTOR_DATA *d;

		for (d = descriptor_list; d != nullptr; d = d->next)
		{
			if (d->snoop_by == dclose)
				d->snoop_by = nullptr;
		}
	}

	if ((ch = dclose->character) != nullptr)
	{
		RS.Logger.Info("Closing link to {}.", ch->name);

		/* cut down on wiznet spam when rebooting */
		if (dclose->connected == CON_PLAYING && !merc_down)
		{
			int ftime = current_time - ch->last_fight_time;
			if (ch->invis_level < 51)
				act("$n has lost $s link.", ch, nullptr, nullptr, TO_ROOM);

			sprintf(buf, "$N has lost $S link (Last fought %s %d %s ago).",
				ch->last_fight_name != nullptr ? ch->last_fight_name : "nobody",
				ch->last_fight_time ? ftime > 600 ? (int)(ftime / 60) : ftime : -1,
				ftime > 600 ? "minutes" : "seconds");
			wiznet(buf, ch, nullptr, WIZ_LINKS, 0, get_trust(ch));

			ch->desc = nullptr;
		}
		else
		{
			free_char(dclose->original ? dclose->original : dclose->character);
		}
	}

	if (d_next == dclose)
		d_next = d_next->next;

	if (dclose == descriptor_list)
	{
		descriptor_list = descriptor_list->next;
	}
	else
	{
		DESCRIPTOR_DATA *d;

		for (d = descriptor_list; d && d->next != dclose; d = d->next);

		if (d != nullptr)
			d->next = dclose->next;
		else
			RS.Logger.Warn("Close_socket: dclose not found.");
	}

	close(dclose->descriptor);
	free_descriptor(dclose);
	return;
}